

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall
FIX::double_conversion::Bignum::AssignHexString(Bignum *this,Vector<const_char> value)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  uint *puVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int j;
  int index;
  Chunk current_bigit;
  uint uVar8;
  int iVar9;
  Vector<const_char> value_local;
  
  value_local.start_ = value.start_;
  iVar9 = value.length_;
  value_local.length_ = iVar9;
  Zero(this);
  iVar5 = iVar9 / 7;
  if (iVar9 < 0x380) {
    iVar9 = iVar9 + -1;
    index = 0;
    iVar6 = iVar5;
    if (iVar5 < 1) {
      iVar6 = index;
    }
    for (; index != iVar6; index = index + 1) {
      uVar8 = 0;
      for (iVar7 = 0; iVar7 != 0x1c; iVar7 = iVar7 + 4) {
        pcVar3 = Vector<const_char>::operator[](&value_local,iVar9);
        iVar1 = HexCharValue(*pcVar3);
        uVar8 = uVar8 + (iVar1 << ((byte)iVar7 & 0x1f));
        iVar9 = iVar9 + -1;
      }
      puVar4 = Vector<unsigned_int>::operator[](&this->bigits_,index);
      *puVar4 = uVar8;
    }
    this->used_digits_ = iVar5;
    uVar8 = 0;
    for (iVar5 = 0; iVar5 <= iVar9; iVar5 = iVar5 + 1) {
      pcVar3 = Vector<const_char>::operator[](&value_local,iVar5);
      uVar2 = HexCharValue(*pcVar3);
      uVar8 = uVar8 << 4 | uVar2;
    }
    if (uVar8 != 0) {
      puVar4 = Vector<unsigned_int>::operator[](&this->bigits_,this->used_digits_);
      *puVar4 = uVar8;
      this->used_digits_ = this->used_digits_ + 1;
    }
    Clamp(this);
    return;
  }
  abort();
}

Assistant:

void Bignum::AssignHexString(Vector<const char> value) {
  Zero();
  int length = value.length();

  int needed_bigits = length * 4 / kBigitSize + 1;
  EnsureCapacity(needed_bigits);
  int string_index = length - 1;
  for (int i = 0; i < needed_bigits - 1; ++i) {
    // These bigits are guaranteed to be "full".
    Chunk current_bigit = 0;
    for (int j = 0; j < kBigitSize / 4; j++) {
      current_bigit += HexCharValue(value[string_index--]) << (j * 4);
    }
    bigits_[i] = current_bigit;
  }
  used_digits_ = needed_bigits - 1;

  Chunk most_significant_bigit = 0;  // Could be = 0;
  for (int j = 0; j <= string_index; ++j) {
    most_significant_bigit <<= 4;
    most_significant_bigit += HexCharValue(value[j]);
  }
  if (most_significant_bigit != 0) {
    bigits_[used_digits_] = most_significant_bigit;
    used_digits_++;
  }
  Clamp();
}